

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# missing_deps_test.cc
# Opt level: O0

void __thiscall
MissingDependencyScannerTestMissingDepFixedDirect::Run
          (MissingDependencyScannerTestMissingDepFixedDirect *this)

{
  Test *this_00;
  bool bVar1;
  MissingDependencyScanner *this_01;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  MissingDependencyScannerTestMissingDepFixedDirect *local_10;
  MissingDependencyScannerTestMissingDepFixedDirect *this_local;
  
  local_10 = this;
  MissingDependencyScannerTest::CreateInitialState(&this->super_MissingDependencyScannerTest);
  MissingDependencyScannerTest::CreateGraphDependencyBetween
            (&this->super_MissingDependencyScannerTest,"compiled_object","generated_header");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"compiled_object",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"generated_header",&local_69);
  MissingDependencyScannerTest::RecordDepsLogDep
            (&this->super_MissingDependencyScannerTest,&local_30,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  MissingDependencyScannerTest::ProcessAllNodes(&this->super_MissingDependencyScannerTest);
  this_00 = g_current_test;
  this_01 = MissingDependencyScannerTest::scanner(&this->super_MissingDependencyScannerTest);
  bVar1 = MissingDependencyScanner::HadMissingDeps(this_01);
  bVar1 = testing::Test::Check
                    (this_00,(bool)((bVar1 ^ 0xffU) & 1),
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/missing_deps_test.cc"
                     ,0x78,"scanner().HadMissingDeps()");
  if (!bVar1) {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(MissingDependencyScannerTest, MissingDepFixedDirect) {
  CreateInitialState();
  // Adding the direct dependency fixes the missing dep
  CreateGraphDependencyBetween("compiled_object", "generated_header");
  RecordDepsLogDep("compiled_object", "generated_header");
  ProcessAllNodes();
  ASSERT_FALSE(scanner().HadMissingDeps());
}